

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  char *pcVar1;
  size_t __n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmOrderDirectories *pcVar5;
  pointer pbVar6;
  string lib;
  string ext;
  string fname;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  bVar2 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar3 = true;
  if (!bVar2) {
    pcVar5 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar5->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar5->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar2 = cmsys::RegularExpression::find
                          (&pcVar5->RemoveLibraryExtension,(name->_M_dataplus)._M_p), bVar2)) {
      pcVar5 = (this->super_cmOrderDirectoriesConstraint).OD;
      pcVar1 = (pcVar5->RemoveLibraryExtension).startp[1];
      local_90 = &local_80;
      if (pcVar1 == (char *)0x0) {
        local_88 = 0;
        local_80 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar1,(pcVar5->RemoveLibraryExtension).endp[1]);
        pcVar5 = (this->super_cmOrderDirectoriesConstraint).OD;
      }
      pcVar1 = (pcVar5->RemoveLibraryExtension).startp[2];
      if (pcVar1 == (char *)0x0) {
        local_70 = &local_60;
        local_68 = 0;
        local_60 = 0;
      }
      else {
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar1,(pcVar5->RemoveLibraryExtension).endp[2]);
        pcVar5 = (this->super_cmOrderDirectoriesConstraint).OD;
      }
      pbVar6 = (pcVar5->LinkExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = true;
      if (pbVar6 != (pcVar5->LinkExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          __n = pbVar6->_M_string_length;
          if ((__n != local_68) ||
             ((__n != 0 && (iVar4 = bcmp((pbVar6->_M_dataplus)._M_p,local_70,__n), iVar4 != 0)))) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_90,local_90 + local_88);
            std::__cxx11::string::_M_append((char *)&local_50,(ulong)(pbVar6->_M_dataplus)._M_p);
            bVar2 = cmOrderDirectoriesConstraint::FileMayConflict
                              (&this->super_cmOrderDirectoriesConstraint,dir,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              bVar2 = false;
              goto LAB_0042f1f3;
            }
            pcVar5 = (this->super_cmOrderDirectoriesConstraint).OD;
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != (pcVar5->LinkExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        bVar2 = true;
      }
LAB_0042f1f3:
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      if (!bVar2) {
        return true;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::vector<std::string>::iterator i =
           this->OD->LinkExtensions.begin();
         i != this->OD->LinkExtensions.end(); ++i) {
      if (*i != ext) {
        std::string fname = lib;
        fname += *i;
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}